

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedCollator::internalGetShortDefinitionString
          (RuleBasedCollator *this,char *locale,char *buffer,int32_t capacity,UErrorCode *errorCode)

{
  int32_t iVar1;
  UColAttributeValue UVar2;
  uint uVar3;
  int32_t iVar4;
  CharString result;
  char subtag [100];
  char resultLocale [158];
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (buffer == (char *)0x0) {
    if (capacity != 0) goto LAB_0024585a;
  }
  else if (capacity < 0) {
LAB_0024585a:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (locale == (char *)0x0) {
    locale = internalGetLocaleID(this,ULOC_VALID_LOCALE,errorCode);
  }
  iVar4 = 0;
  iVar1 = ucol_getFunctionalEquivalent_63
                    (resultLocale,0x9d,"collation",locale,(UBool *)0x0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (iVar1 == 0) {
      builtin_strncpy(resultLocale,"root",5);
    }
    else {
      resultLocale[iVar1] = '\0';
    }
    MaybeStackArray<char,_40>::MaybeStackArray(&result.buffer);
    result.len = 0;
    *result.buffer.ptr = '\0';
    uVar3 = this->explicitlySetAttributes;
    if ((uVar3 & 2) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,1,errorCode);
      anon_unknown_16::appendAttribute(&result,'A',UVar2,errorCode);
      uVar3 = this->explicitlySetAttributes;
    }
    if ((uVar3 & 4) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,2,errorCode);
      anon_unknown_16::appendAttribute(&result,'C',UVar2,errorCode);
      uVar3 = this->explicitlySetAttributes;
    }
    if ((char)uVar3 < '\0') {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,7,errorCode);
      anon_unknown_16::appendAttribute(&result,'D',UVar2,errorCode);
      uVar3 = this->explicitlySetAttributes;
    }
    if ((uVar3 & 8) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,3,errorCode);
      anon_unknown_16::appendAttribute(&result,'E',UVar2,errorCode);
      uVar3 = this->explicitlySetAttributes;
    }
    if ((uVar3 & 1) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,0,errorCode);
      anon_unknown_16::appendAttribute(&result,'F',UVar2,errorCode);
    }
    iVar1 = uloc_getKeywordValue_63(resultLocale,"collation",subtag,100,errorCode);
    anon_unknown_16::appendSubtag(&result,'K',subtag,iVar1,errorCode);
    iVar1 = uloc_getLanguage_63(resultLocale,subtag,100,errorCode);
    anon_unknown_16::appendSubtag(&result,'L',subtag,iVar1,errorCode);
    if ((this->explicitlySetAttributes & 0x10) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,4,errorCode);
      anon_unknown_16::appendAttribute(&result,'N',UVar2,errorCode);
    }
    iVar1 = uloc_getCountry_63(resultLocale,subtag,100,errorCode);
    anon_unknown_16::appendSubtag(&result,'R',subtag,iVar1,errorCode);
    if ((this->explicitlySetAttributes & 0x20) != 0) {
      UVar2 = (*(this->super_Collator).super_UObject._vptr_UObject[0x18])(this,5,errorCode);
      anon_unknown_16::appendAttribute(&result,'S',UVar2,errorCode);
    }
    iVar1 = uloc_getVariant_63(resultLocale,subtag,100,errorCode);
    anon_unknown_16::appendSubtag(&result,'V',subtag,iVar1,errorCode);
    iVar1 = uloc_getScript_63(resultLocale,subtag,100,errorCode);
    anon_unknown_16::appendSubtag(&result,'Z',subtag,iVar1,errorCode);
    iVar1 = result.len;
    iVar4 = 0;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (result.len <= capacity) {
        memcpy(buffer,result.buffer.ptr,(long)result.len);
      }
      iVar4 = u_terminateChars_63(buffer,capacity,iVar1,errorCode);
    }
    MaybeStackArray<char,_40>::~MaybeStackArray(&result.buffer);
  }
  return iVar4;
}

Assistant:

int32_t
RuleBasedCollator::internalGetShortDefinitionString(const char *locale,
                                                    char *buffer, int32_t capacity,
                                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(buffer == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(locale == NULL) {
        locale = internalGetLocaleID(ULOC_VALID_LOCALE, errorCode);
    }

    char resultLocale[ULOC_FULLNAME_CAPACITY + 1];
    int32_t length = ucol_getFunctionalEquivalent(resultLocale, ULOC_FULLNAME_CAPACITY,
                                                  "collation", locale,
                                                  NULL, &errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    if(length == 0) {
        uprv_strcpy(resultLocale, "root");
    } else {
        resultLocale[length] = 0;
    }

    // Append items in alphabetic order of their short definition letters.
    CharString result;
    char subtag[ULOC_KEYWORD_AND_VALUES_CAPACITY];

    if(attributeHasBeenSetExplicitly(UCOL_ALTERNATE_HANDLING)) {
        appendAttribute(result, 'A', getAttribute(UCOL_ALTERNATE_HANDLING, errorCode), errorCode);
    }
    // ATTR_VARIABLE_TOP not supported because 'B' was broken.
    // See ICU tickets #10372 and #10386.
    if(attributeHasBeenSetExplicitly(UCOL_CASE_FIRST)) {
        appendAttribute(result, 'C', getAttribute(UCOL_CASE_FIRST, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_NUMERIC_COLLATION)) {
        appendAttribute(result, 'D', getAttribute(UCOL_NUMERIC_COLLATION, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_CASE_LEVEL)) {
        appendAttribute(result, 'E', getAttribute(UCOL_CASE_LEVEL, errorCode), errorCode);
    }
    if(attributeHasBeenSetExplicitly(UCOL_FRENCH_COLLATION)) {
        appendAttribute(result, 'F', getAttribute(UCOL_FRENCH_COLLATION, errorCode), errorCode);
    }
    // Note: UCOL_HIRAGANA_QUATERNARY_MODE is deprecated and never changes away from default.
    length = uloc_getKeywordValue(resultLocale, "collation", subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'K', subtag, length, errorCode);
    length = uloc_getLanguage(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'L', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_NORMALIZATION_MODE)) {
        appendAttribute(result, 'N', getAttribute(UCOL_NORMALIZATION_MODE, errorCode), errorCode);
    }
    length = uloc_getCountry(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'R', subtag, length, errorCode);
    if(attributeHasBeenSetExplicitly(UCOL_STRENGTH)) {
        appendAttribute(result, 'S', getAttribute(UCOL_STRENGTH, errorCode), errorCode);
    }
    length = uloc_getVariant(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'V', subtag, length, errorCode);
    length = uloc_getScript(resultLocale, subtag, UPRV_LENGTHOF(subtag), &errorCode);
    appendSubtag(result, 'Z', subtag, length, errorCode);

    if(U_FAILURE(errorCode)) { return 0; }
    if(result.length() <= capacity) {
        uprv_memcpy(buffer, result.data(), result.length());
    }
    return u_terminateChars(buffer, capacity, result.length(), &errorCode);
}